

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14PrivateEnums.cpp
# Opt level: O0

ENUM__fx_opaque_enum
COLLADASaxFWL14::toEnum_ENUM__fx_opaque_enum
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL14::ENUM__fx_opaque_enum> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  ENUM__fx_opaque_enum EVar1;
  _func_unsigned_long_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *in_RDI;
  
  EVar1 = GeneratedSaxParser::Utils::
          toEnum<COLLADASaxFWL14::ENUM__fx_opaque_enum,_unsigned_long,_(COLLADASaxFWL14::ENUM__fx_opaque_enum)2>
                    ((ParserChar **)bufferEnd,failed,(bool *)enumMap,
                     (pair<unsigned_long,_COLLADASaxFWL14::ENUM__fx_opaque_enum> *)
                     baseConversionFunc,in_RDI);
  return EVar1;
}

Assistant:

ENUM__fx_opaque_enum toEnum_ENUM__fx_opaque_enum (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__fx_opaque_enum>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__fx_opaque_enum, StringHash, ENUM__fx_opaque_enum__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}